

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Quat4f.cpp
# Opt level: O1

Quat4f __thiscall Quat4f::randomRotation(Quat4f *this,float u0,float u1,float u2)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Quat4f QVar9;
  
  fVar1 = 1.0 - u0 * u0;
  if (fVar1 < 0.0) {
    fVar1 = sqrtf(fVar1);
  }
  else {
    fVar1 = SQRT(fVar1);
  }
  dVar3 = (double)(u2 * 3.1415927);
  dVar4 = cos(dVar3);
  dVar5 = sin(dVar3);
  dVar6 = cos((double)(u1 * 6.2831855));
  dVar7 = sin(dVar3);
  dVar8 = sin((double)(u1 * 6.2831855));
  fVar2 = (float)(dVar8 * dVar7 * (double)fVar1);
  dVar3 = sin(dVar3);
  QVar9.m_elements[0] = (float)((double)u0 * dVar3);
  QVar9.m_elements[1] = 0.0;
  this->m_elements[0] = (float)dVar4;
  this->m_elements[1] = (float)(dVar6 * dVar5 * (double)fVar1);
  this->m_elements[2] = fVar2;
  this->m_elements[3] = QVar9.m_elements[0];
  QVar9.m_elements[2] = fVar2;
  QVar9.m_elements[3] = 0.0;
  return (Quat4f)QVar9.m_elements;
}

Assistant:

Quat4f Quat4f::randomRotation( float u0, float u1, float u2 )
{
	float z = u0;
	float theta = static_cast< float >( 2.f * M_PI * u1 );
	float r = sqrt( 1.f - z * z );
	float w = static_cast< float >( M_PI * u2 );

	return Quat4f
	(
		cos( w ),
		sin( w ) * cos( theta ) * r,
		sin( w ) * sin( theta ) * r,
		sin( w ) * z
	);
}